

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btSoftRigidDynamicsWorld::serialize(btSoftRigidDynamicsWorld *this,btSerializer *serializer)

{
  (**(code **)(*(long *)serializer + 0x40))(serializer);
  btDiscreteDynamicsWorld::serializeDynamicsWorldInfo
            (&this->super_btDiscreteDynamicsWorld,serializer);
  serializeSoftBodies(this,serializer);
  btDiscreteDynamicsWorld::serializeRigidBodies(&this->super_btDiscreteDynamicsWorld,serializer);
  btCollisionWorld::serializeCollisionObjects((btCollisionWorld *)this,serializer);
  (**(code **)(*(long *)serializer + 0x48))(serializer);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::serialize(btSerializer* serializer)
{

	serializer->startSerialization();

	serializeDynamicsWorldInfo( serializer);

	serializeSoftBodies(serializer);

	serializeRigidBodies(serializer);

	serializeCollisionObjects(serializer);

	serializer->finishSerialization();
}